

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

opj_pi_iterator_t * opj_pi_create(opj_image_t *image,opj_cp_t *cp,OPJ_UINT32 tileno)

{
  opj_tcp_t *poVar1;
  opj_tccp_t *poVar2;
  uint p_nb_elements;
  opj_pi_resolution_t *poVar3;
  void *pvVar4;
  opj_pi_comp_t *comp;
  opj_pi_iterator_t *l_current_pi;
  opj_tccp_t *tccp;
  opj_tcp_t *tcp;
  opj_pi_iterator_t *l_pi;
  OPJ_UINT32 l_poc_bound;
  OPJ_UINT32 compno;
  OPJ_UINT32 pino;
  OPJ_UINT32 tileno_local;
  opj_cp_t *cp_local;
  opj_image_t *image_local;
  
  if (cp == (opj_cp_t *)0x0) {
    __assert_fail("cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,1000,
                  "opj_pi_iterator_t *opj_pi_create(const opj_image_t *, const opj_cp_t *, OPJ_UINT32)"
                 );
  }
  if (image != (opj_image_t *)0x0) {
    if (cp->tw * cp->th <= tileno) {
      __assert_fail("tileno < cp->tw * cp->th",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                    ,0x3ea,
                    "opj_pi_iterator_t *opj_pi_create(const opj_image_t *, const opj_cp_t *, OPJ_UINT32)"
                   );
    }
    poVar1 = cp->tcps;
    p_nb_elements = poVar1[tileno].numpocs + 1;
    image_local = (opj_image_t *)opj_calloc((ulong)p_nb_elements,0xf8);
    if ((opj_pi_iterator_t *)image_local == (opj_pi_iterator_t *)0x0) {
      image_local = (opj_image_t *)0x0;
    }
    else {
      comp = (opj_pi_comp_t *)image_local;
      for (l_poc_bound = 0; l_poc_bound < p_nb_elements; l_poc_bound = l_poc_bound + 1) {
        poVar3 = (opj_pi_resolution_t *)opj_calloc((ulong)image->numcomps,0x18);
        comp[8].resolutions = poVar3;
        if (comp[8].resolutions == (opj_pi_resolution_t *)0x0) {
          opj_pi_destroy((opj_pi_iterator_t *)image_local,p_nb_elements);
          return (opj_pi_iterator_t *)0x0;
        }
        *(OPJ_UINT32 *)&comp[8].field_0xc = image->numcomps;
        for (l_pi._4_4_ = 0; l_pi._4_4_ < image->numcomps; l_pi._4_4_ = l_pi._4_4_ + 1) {
          poVar3 = comp[8].resolutions;
          poVar2 = poVar1[tileno].tccps;
          pvVar4 = opj_calloc((ulong)poVar2[l_pi._4_4_].numresolutions,0x10);
          *(void **)((long)poVar3 + (ulong)l_pi._4_4_ * 0x18 + 0x10) = pvVar4;
          if (*(long *)((long)poVar3 + (ulong)l_pi._4_4_ * 0x18 + 0x10) == 0) {
            opj_pi_destroy((opj_pi_iterator_t *)image_local,p_nb_elements);
            return (opj_pi_iterator_t *)0x0;
          }
          *(OPJ_UINT32 *)((long)poVar3 + (ulong)l_pi._4_4_ * 0x18 + 8) =
               poVar2[l_pi._4_4_].numresolutions;
        }
        comp = (opj_pi_comp_t *)&comp[10].numresolutions;
      }
    }
    return (opj_pi_iterator_t *)image_local;
  }
  __assert_fail("image != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                ,0x3e9,
                "opj_pi_iterator_t *opj_pi_create(const opj_image_t *, const opj_cp_t *, OPJ_UINT32)"
               );
}

Assistant:

static opj_pi_iterator_t * opj_pi_create(const opj_image_t *image,
        const opj_cp_t *cp,
        OPJ_UINT32 tileno)
{
    /* loop*/
    OPJ_UINT32 pino, compno;
    /* number of poc in the p_pi*/
    OPJ_UINT32 l_poc_bound;

    /* pointers to tile coding parameters and components.*/
    opj_pi_iterator_t *l_pi = 00;
    opj_tcp_t *tcp = 00;
    const opj_tccp_t *tccp = 00;

    /* current packet iterator being allocated*/
    opj_pi_iterator_t *l_current_pi = 00;

    /* preconditions in debug*/
    assert(cp != 00);
    assert(image != 00);
    assert(tileno < cp->tw * cp->th);

    /* initializations*/
    tcp = &cp->tcps[tileno];
    l_poc_bound = tcp->numpocs + 1;

    /* memory allocations*/
    l_pi = (opj_pi_iterator_t*) opj_calloc((l_poc_bound),
                                           sizeof(opj_pi_iterator_t));
    if (!l_pi) {
        return NULL;
    }

    l_current_pi = l_pi;
    for (pino = 0; pino < l_poc_bound ; ++pino) {

        l_current_pi->comps = (opj_pi_comp_t*) opj_calloc(image->numcomps,
                              sizeof(opj_pi_comp_t));
        if (! l_current_pi->comps) {
            opj_pi_destroy(l_pi, l_poc_bound);
            return NULL;
        }

        l_current_pi->numcomps = image->numcomps;

        for (compno = 0; compno < image->numcomps; ++compno) {
            opj_pi_comp_t *comp = &l_current_pi->comps[compno];

            tccp = &tcp->tccps[compno];

            comp->resolutions = (opj_pi_resolution_t*) opj_calloc(tccp->numresolutions,
                                sizeof(opj_pi_resolution_t));
            if (!comp->resolutions) {
                opj_pi_destroy(l_pi, l_poc_bound);
                return 00;
            }

            comp->numresolutions = tccp->numresolutions;
        }
        ++l_current_pi;
    }
    return l_pi;
}